

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void destroyShellObjects(_GLFWwindow *window)

{
  _GLFWwindow *window_local;
  
  destroyFallbackDecorations(window);
  if ((window->wl).libdecor.frame != (libdecor_frame *)0x0) {
    (*_glfw.wl.libdecor.libdecor_frame_unref_)((window->wl).libdecor.frame);
  }
  if ((window->wl).xdg.decoration != (zxdg_toplevel_decoration_v1 *)0x0) {
    zxdg_toplevel_decoration_v1_destroy((window->wl).xdg.decoration);
  }
  if ((window->wl).xdg.toplevel != (xdg_toplevel *)0x0) {
    xdg_toplevel_destroy((window->wl).xdg.toplevel);
  }
  if ((window->wl).xdg.surface != (xdg_surface *)0x0) {
    xdg_surface_destroy((window->wl).xdg.surface);
  }
  (window->wl).libdecor.frame = (libdecor_frame *)0x0;
  (window->wl).xdg.decoration = (zxdg_toplevel_decoration_v1 *)0x0;
  (window->wl).xdg.decorationMode = 0;
  (window->wl).xdg.toplevel = (xdg_toplevel *)0x0;
  (window->wl).xdg.surface = (xdg_surface *)0x0;
  return;
}

Assistant:

static void destroyShellObjects(_GLFWwindow* window)
{
    destroyFallbackDecorations(window);

    if (window->wl.libdecor.frame)
        libdecor_frame_unref(window->wl.libdecor.frame);

    if (window->wl.xdg.decoration)
        zxdg_toplevel_decoration_v1_destroy(window->wl.xdg.decoration);

    if (window->wl.xdg.toplevel)
        xdg_toplevel_destroy(window->wl.xdg.toplevel);

    if (window->wl.xdg.surface)
        xdg_surface_destroy(window->wl.xdg.surface);

    window->wl.libdecor.frame = NULL;
    window->wl.xdg.decoration = NULL;
    window->wl.xdg.decorationMode = 0;
    window->wl.xdg.toplevel = NULL;
    window->wl.xdg.surface = NULL;
}